

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

int64_t my_pow(int64_t base,int64_t exponent)

{
  int64_t iVar1;
  long lVar2;
  
  if (exponent == 0) {
    return 1;
  }
  if (base != 0) {
    if (1 < exponent) {
      lVar2 = exponent + -1;
      iVar1 = base;
      do {
        iVar1 = iVar1 * base;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      return iVar1;
    }
    return base;
  }
  return 0;
}

Assistant:

int64_t my_pow(const int64_t base, const int64_t exponent) {
	assert(exponent >= 0);
	if (exponent == 0) {
		return 1;
	}
	if (base == 0) {
		return 0;
	}
	int64_t z = base;
	for (int i = 1; i < exponent; i++) {
		z *= base;
	}
	return z;
}